

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Amiga.cpp
# Opt level: O3

HalfCycles __thiscall
Amiga::ConcreteMachine::perform_bus_operation<CPU::MC68000::Microcycle<321u>>
          (ConcreteMachine *this,Microcycle<321U> *cycle,int param_2)

{
  HalfCycles length;
  long lVar1;
  ulong uVar2;
  size_t __n;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  LogLine local_38;
  
  length.super_WrappedInt<HalfCycles>.length_ =
       (WrappedInt<HalfCycles>)(cycle->length).super_WrappedInt<HalfCycles>.length_;
  Chipset::run_for(&this->chipset_,length);
  (this->mc68000_).super_ProcessorBase.bus_interrupt_level_ = (this->chipset_).interrupt_level_;
  uVar4 = *cycle->address;
  uVar5 = uVar4 & 0xffffff;
  uVar2 = (ulong)uVar5 ^ 1;
  (this->mc68000_).super_ProcessorBase.vpa_ = (uVar4 & 0xe00000) == 0xa00000;
  __n = (size_t)(uVar4 >> 0xe & 0x3f0);
  uVar3 = *(uint *)((long)&(this->memory_).regions[0].read_write_mask + __n);
  if (uVar3 == 0) {
    if ((uVar4 & 0xe00000) == 0xa00000) {
      if ((uVar4 >> 0xc & 1) == 0) {
        MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::write
                  (&(this->chipset_).cia_a,uVar5 >> 8,(void *)(ulong)(cycle->value->field_1).b,__n);
      }
      if ((uVar4 >> 0xd & 1) == 0) {
        MOS::MOS6526::MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1>::write
                  (&(this->chipset_).cia_b,uVar5 >> 8,(void *)(ulong)(cycle->value->field_1).b,__n);
      }
    }
    else if ((int)uVar2 - 0xdff000U < 0x1bf) {
      Chipset::write(&this->chipset_,uVar4 & 0x1fe,
                     (void *)(ulong)CONCAT11(*(undefined1 *)cycle->value,*(undefined1 *)cycle->value
                                            ),1);
    }
    else if ((uVar4 & 0xff0000) == 0xe80000) {
      MemoryMap::perform<CPU::MC68000::Microcycle<321u>>(&this->memory_,cycle);
    }
    else if (uVar5 < 0xf00000) {
      local_38.stream_ = (FILE *)_stderr;
      Log::Logger<(Log::Source)2>::LogLine::append
                (&local_38,"Unmapped %s %06x of %04x","write to ",(ulong)uVar5,
                 (ulong)CONCAT11(*(undefined1 *)cycle->value,*(undefined1 *)cycle->value));
      fputc(10,(FILE *)local_38.stream_);
    }
  }
  else {
    uVar3 = uVar3 & 0x1e;
    uVar4 = uVar3 << 0x1e | uVar3 - 0xc >> 2;
    if (uVar4 < 5) {
      lVar1 = *(long *)((long)&(this->memory_).regions[0].contents + __n);
      switch(uVar4) {
      default:
        (cycle->value->field_1).b = *(uint8_t *)(lVar1 + uVar2);
        break;
      case 1:
      case 3:
        *(uint8_t *)(lVar1 + uVar2) = (cycle->value->field_1).b;
        break;
      case 2:
        break;
      }
    }
  }
  return (HalfCycles)
         (WrappedInt<HalfCycles>)
         ((long)length.super_WrappedInt<HalfCycles>.length_ -
         (cycle->length).super_WrappedInt<HalfCycles>.length_);
}

Assistant:

HalfCycles perform_bus_operation(const Microcycle &cycle, int) {
			// Do a quick advance check for Chip RAM access; add a suitable delay if required.
			HalfCycles total_length;
			if(cycle.operation & CPU::MC68000::Operation::NewAddress && *cycle.address < 0x20'0000) {
				total_length = chipset_.run_until_after_cpu_slot().duration;
				assert(total_length >= cycle.length);
			} else {
				total_length = cycle.length;
				chipset_.run_for(total_length);
			}
			mc68000_.set_interrupt_level(chipset_.get_interrupt_level());

			// Check for assertion of reset.
			if(cycle.operation & CPU::MC68000::Operation::Reset) {
				memory_.reset();
				logger.info().append("Reset; PC is around %08x", mc68000_.get_state().registers.program_counter);
			}

			// Autovector interrupts.
			if(cycle.operation & CPU::MC68000::Operation::InterruptAcknowledge) {
				mc68000_.set_is_peripheral_address(true);
				return total_length - cycle.length;
			}

			// Do nothing if no address is exposed.
			if(!(cycle.operation & (CPU::MC68000::Operation::NewAddress | CPU::MC68000::Operation::SameAddress))) return total_length - cycle.length;

			// Grab the target address to pick a memory source.
			const uint32_t address = cycle.host_endian_byte_address();

			// Set VPA if this is [going to be] a CIA access.
			mc68000_.set_is_peripheral_address((address & 0xe0'0000) == 0xa0'0000);

			if(!memory_.regions[address >> 18].read_write_mask) {
				if((cycle.operation & (CPU::MC68000::Operation::SelectByte | CPU::MC68000::Operation::SelectWord))) {
					// Check for various potential chip accesses.

					// Per the manual:
					//
					// CIA A is: 101x xxxx xx01 rrrr xxxx xxx0 (i.e. loaded into high byte)
					// CIA B is: 101x xxxx xx10 rrrr xxxx xxx1 (i.e. loaded into low byte)
					//
					// but in order to map 0xbfexxx to CIA A and 0xbfdxxx to CIA B, I think
					// these might be listed the wrong way around.
					//
					// Additional assumption: the relevant CIA select lines are connected
					// directly to the chip enables.
					if((address & 0xe0'0000) == 0xa0'0000) {
						const int reg = address >> 8;
						const bool select_a = !(address & 0x1000);
						const bool select_b = !(address & 0x2000);

						if(cycle.operation & CPU::MC68000::Operation::Read) {
							uint16_t result = 0xffff;
							if(select_a) result &= 0xff00 | (chipset_.cia_a.read(reg) << 0);
							if(select_b) result &= 0x00ff | (chipset_.cia_b.read(reg) << 8);
							cycle.set_value16(result);
						} else {
							if(select_a) chipset_.cia_a.write(reg, cycle.value8_low());
							if(select_b) chipset_.cia_b.write(reg, cycle.value8_high());
						}

//						logger.info().append("CIA %d %s %d of %04x", ((address >> 12) & 3)^3, operation & Microcycle::Read ? "read" : "write", reg & 0xf, cycle.value16());
					} else if(address >= 0xdf'f000 && address <= 0xdf'f1be) {
						chipset_.perform(cycle);
					} else if(address >= 0xe8'0000 && address < 0xe9'0000) {
						// This is the Autoconf space; right now the only
						// Autoconf device this emulator implements is fast RAM,
						// which if present is provided as part of the memory map.
						//
						// Relevant quote: "The Zorro II configuration space is the 64K memory block $00E8xxxx"
						memory_.perform(cycle);
					} else {
						// This'll do for open bus, for now.
						if(cycle.operation & CPU::MC68000::Operation::Read) {
							cycle.set_value16(0xffff);
						}

						// Log only for the region that is definitely not just ROM this machine doesn't have.
						if(address < 0xf0'0000) {
							logger.error().append("Unmapped %s %06x of %04x", cycle.operation & CPU::MC68000::Operation::Read ? "read from " : "write to ", (*cycle.address)&0xffffff, cycle.value16());
						}
					}
				}
			} else {
				// A regular memory access.
				cycle.apply(
					&memory_.regions[address >> 18].contents[address],
					memory_.regions[address >> 18].read_write_mask
				);
			}

			return total_length - cycle.length;
		}